

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLFileReader<MockFile>::Read<TestNLHandler>
          (NLFileReader<MockFile> *this,CStringRef filename,TestNLHandler *handler,int flags)

{
  CStringRef name;
  CStringRef name_00;
  int in_R9D;
  NLStringRef str;
  NLStringRef str_00;
  MemoryMappedFile<MockFile> mapped_file;
  MemoryBuffer<char,_1UL,_std::allocator<char>_> local_78;
  NLStringRef local_50;
  NLStringRef local_40;
  
  Open(this,filename);
  if (this->size_ == this->rounded_size_) {
    local_78.super_Buffer<char>.size_ = 0;
    local_78.super_Buffer<char>.capacity_ = 1;
    local_78.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002f5648;
    local_78.super_Buffer<char>.ptr_ = local_78.data_;
    Read(this,&local_78);
    NLStringRef::NLStringRef(&local_40,local_78.super_Buffer<char>.ptr_,this->size_);
    name.data_._4_4_ = 0;
    name.data_._0_4_ = flags;
    str.size_ = (size_t)handler;
    str.data_ = (char *)local_40.size_;
    ReadNLString<TestNLHandler>
              ((mp *)local_40.data_,str,(TestNLHandler *)filename.data_,name,in_R9D);
    local_78.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002f5648;
    if (local_78.super_Buffer<char>.ptr_ != local_78.data_) {
      operator_delete(local_78.super_Buffer<char>.ptr_,local_78.super_Buffer<char>.capacity_);
    }
  }
  else {
    MemoryMappedFile<MockFile>::MemoryMappedFile
              ((MemoryMappedFile<MockFile> *)&local_78,&this->file_,this->rounded_size_);
    NLStringRef::NLStringRef(&local_50,(char *)local_78.super_Buffer<char>._vptr_Buffer,this->size_)
    ;
    name_00.data_._4_4_ = 0;
    name_00.data_._0_4_ = flags;
    str_00.size_ = (size_t)handler;
    str_00.data_ = (char *)local_50.size_;
    ReadNLString<TestNLHandler>
              ((mp *)local_50.data_,str_00,(TestNLHandler *)filename.data_,name_00,in_R9D);
    MemoryMappedFileBase::~MemoryMappedFileBase((MemoryMappedFileBase *)&local_78);
  }
  return;
}

Assistant:

void Read(fmt::CStringRef filename, Handler &handler, int flags) {
    Open(filename);
    if (size_ == rounded_size_) {
      // Don't use mmap, because the file size is a multiple of the page size
      // and therefore the mmap'ed buffer won't be null-terminated.
      fmt::internal::MemoryBuffer<char, 1> array;
      Read(array);
      return ReadNLString(
            NLStringRef(&array[0], size_), handler, filename, flags);
    }
    MemoryMappedFile<File> mapped_file(file_, rounded_size_);
    ReadNLString(
          NLStringRef(mapped_file.start(), size_), handler, filename, flags);
  }